

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O1

void __thiscall YAML::NodeBuilder::Push(NodeBuilder *this,node *node)

{
  pointer *pppnVar1;
  iterator __position;
  element_type *peVar2;
  pointer ppVar3;
  ulong uVar4;
  pointer ppVar5;
  bool local_29;
  node *local_28;
  
  __position._M_current =
       (this->m_stack).
       super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = node;
  if ((((this->m_stack).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_start == __position._M_current) ||
      (peVar2 = (((__position._M_current[-1]->m_pRef).
                  super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar2->m_isDefined != true)) || (peVar2->m_type != Map)) {
    if (__position._M_current ==
        (this->m_stack).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
      _M_realloc_insert<YAML::detail::node*>
                ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)&this->m_stack,
                 __position,&local_28);
    }
    else {
      *__position._M_current = node;
      pppnVar1 = &(this->m_stack).
                  super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppnVar1 = *pppnVar1 + 1;
    }
  }
  else {
    ppVar3 = (this->m_keys).
             super__Vector_base<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = this->m_mapDepth;
    ppVar5 = (this->m_keys).
             super__Vector_base<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (this->m_stack).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
      _M_realloc_insert<YAML::detail::node*>
                ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)&this->m_stack,
                 __position,&local_28);
    }
    else {
      *__position._M_current = node;
      pppnVar1 = &(this->m_stack).
                  super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppnVar1 = *pppnVar1 + 1;
    }
    if ((ulong)((long)ppVar3 - (long)ppVar5 >> 4) < uVar4) {
      local_29 = false;
      local_28 = node;
      std::
      vector<std::pair<YAML::detail::node*,bool>,std::allocator<std::pair<YAML::detail::node*,bool>>>
      ::emplace_back<YAML::detail::node*,bool>
                ((vector<std::pair<YAML::detail::node*,bool>,std::allocator<std::pair<YAML::detail::node*,bool>>>
                  *)&this->m_keys,&local_28,&local_29);
    }
  }
  return;
}

Assistant:

void NodeBuilder::Push(detail::node& node) {
  const bool needsKey =
      (!m_stack.empty() && m_stack.back()->type() == NodeType::Map &&
       m_keys.size() < m_mapDepth);

  m_stack.push_back(&node);
  if (needsKey)
    m_keys.emplace_back(&node, false);
}